

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptArray * Js::JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ArrayCallSiteInfo *this;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  FunctionInfo *pFVar7;
  undefined1 uVar8;
  undefined1 local_f0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_40;
  JavascriptFunction *caller;
  
  pTVar1 = ((((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  uVar8 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&intArray->super_JavascriptNativeArray);
  if (this != (ArrayCallSiteInfo *)0x0) {
    caller._7_1_ = uVar8;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_f0,
               (((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,true,(PVOID)0x0,false);
    local_40 = (JavascriptFunction *)0x0;
    do {
      do {
        BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_f0,&local_40,true);
        if (BVar4 == 0) {
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase);
          if (!bVar3) goto LAB_00b6ed74;
          Output::Print(L"Conversion: Int array to Var array across ScriptContexts");
          goto LAB_00b6ed6f;
        }
      } while (local_40 == (JavascriptFunction *)0x0);
      BVar4 = JavascriptFunction::IsScriptFunction(local_40);
    } while (BVar4 == 0);
    if (local_40 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x854,"(caller)","caller");
      if (!bVar3) goto LAB_00b6edb8;
      *puVar5 = 0;
    }
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x855,"(caller->GetFunctionBody())","caller->GetFunctionBody()");
      if (!bVar3) goto LAB_00b6edb8;
      *puVar5 = 0;
    }
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    walker.currentFrame.stackCheckCodeHeight._4_4_ =
         FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar6);
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    pFVar7 = (pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_00b6edb8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      pFVar7 = (pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase,
                              walker.currentFrame.stackCheckCodeHeight._4_4_,pFVar7->functionId);
    if (bVar3) {
      Output::Print(L"Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
LAB_00b6ed6f:
      Output::Flush();
    }
LAB_00b6ed74:
    ArrayCallSiteInfo::SetIsNotNativeArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_f0);
    uVar8 = caller._7_1_;
  }
  (intArray->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  ConvertToVarArray(intArray);
  pTVar1->noJsReentrancy = (bool)uVar8;
  return (JavascriptArray *)intArray;
}

Assistant:

JavascriptArray *JavascriptNativeIntArray::ToVarArray(JavascriptNativeIntArray *intArray)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToVarArray, reentrancylock, intArray->GetScriptContext()->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Var array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Var array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeArray();
        }
#endif

        intArray->ClearArrayCallSiteIndex();

        return ConvertToVarArray(intArray);
        JIT_HELPER_END(IntArr_ToVarArray);
    }